

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac.h
# Opt level: O0

string * binpac::(anonymous_namespace)::strfmt_abi_cxx11_(char *format,...)

{
  allocator<char> *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  string *in_RDI;
  char *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  char *r;
  va_list ap;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  allocator<char> local_31;
  char *local_30;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined8 local_10;
  string *local_8;
  
  local_18 = local_f8;
  local_20 = &stack0x00000008;
  local_24 = 0x30;
  local_28 = 0x10;
  local_e8 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_30 = anon_unknown_3::do_fmt((char *)in_RDI,(__va_list_tag *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_R9,in_R8,in_RCX);
  std::allocator<char>::~allocator(&local_31);
  return in_RDI;
}

Assistant:

inline string strfmt(const char* format, ...)
	{
	va_list ap;
	va_start(ap, format);
	const char* r = do_fmt(format, ap);
	va_end(ap);
	return string(r);
	}